

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

void Fra_ImpRecordInManager(Fra_Man_t *p,Aig_Man_t *pNew)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pDriver;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  
  pVVar3 = p->pCla->vImps;
  if ((pVVar3 != (Vec_Int_t *)0x0) && (pVVar3->nSize != 0)) {
    iVar1 = pNew->nObjs[3];
    pVVar3 = p->pCla->vImps;
    if (0 < pVVar3->nSize) {
      lVar6 = 0;
      do {
        pVVar2 = p->pManAig->vObjs;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pvVar5 = (void *)0x0;
        }
        else {
          uVar4 = pVVar3->pArray[lVar6] & 0xffff;
          if (pVVar2->nSize <= (int)uVar4) goto LAB_0068ebd5;
          pvVar5 = pVVar2->pArray[uVar4];
        }
        uVar4 = pVVar3->pArray[lVar6] >> 0x10;
        if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) {
LAB_0068ebd5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pDriver = Aig_Or(pNew,(Aig_Obj_t *)
                              ((ulong)(*(uint *)((long)pvVar5 + 0x18) >> 3 & 1) ^
                               *(ulong *)((long)pvVar5 + 0x28) ^ 1),
                         (Aig_Obj_t *)
                         ((ulong)(*(uint *)((long)pVVar2->pArray[uVar4] + 0x18) >> 3 & 1) ^
                         *(ulong *)((long)pVVar2->pArray[uVar4] + 0x28)));
        Aig_ObjCreateCo(pNew,pDriver);
        lVar6 = lVar6 + 1;
        pVVar3 = p->pCla->vImps;
      } while (lVar6 < pVVar3->nSize);
    }
    pNew->nAsserts = pNew->nObjs[3] - iVar1;
  }
  return;
}

Assistant:

void Fra_ImpRecordInManager( Fra_Man_t * p, Aig_Man_t * pNew )
{
    Aig_Obj_t * pLeft, * pRight, * pMiter;
    int nPosOld, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return;
    // go through the implication
    nPosOld = Aig_ManCoNum(pNew);
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // record the implication: L' + R
        pMiter = Aig_Or( pNew, 
            Aig_NotCond((Aig_Obj_t *)pLeft->pData, !pLeft->fPhase), 
            Aig_NotCond((Aig_Obj_t *)pRight->pData, pRight->fPhase) ); 
        Aig_ObjCreateCo( pNew, pMiter );
    }
    pNew->nAsserts = Aig_ManCoNum(pNew) - nPosOld;
}